

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NFiles.cpp
# Opt level: O0

Vector<int,_std::allocator<int>_> * __thiscall
amrex::NFilesIter::FileNumbersWritten(NFilesIter *this)

{
  long lVar1;
  Long LVar2;
  Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  *this_00;
  int *piVar3;
  int *in_RSI;
  Vector<int,_std::allocator<int>_> *in_RDI;
  int r;
  int f;
  Vector<int,_std::allocator<int>_> *fileNumbersWritten;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  value_type *in_stack_ffffffffffffff90;
  size_type in_stack_ffffffffffffff98;
  int local_34;
  int local_30;
  
  std::allocator<int>::allocator((allocator<int> *)0x123f8fa);
  Vector<int,_std::allocator<int>_>::vector
            (in_RDI,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  std::allocator<int>::~allocator((allocator<int> *)0x123f91f);
  if (*in_RSI == in_RSI[0xb3]) {
    local_30 = 0;
    while( true ) {
      lVar1 = (long)local_30;
      LVar2 = Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
              ::size((Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                      *)0x123f955);
      if (LVar2 <= lVar1) break;
      local_34 = 0;
      while( true ) {
        this_00 = (Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                   *)(long)local_34;
        Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
        ::operator[](this_00,CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        LVar2 = Vector<int,_std::allocator<int>_>::size
                          ((Vector<int,_std::allocator<int>_> *)0x123f996);
        if (LVar2 <= (long)this_00) break;
        in_stack_ffffffffffffff8c = local_30;
        Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
        ::operator[](this_00,CONCAT44(local_30,in_stack_ffffffffffffff88));
        Vector<int,_std::allocator<int>_>::operator[]
                  ((Vector<int,_std::allocator<int>_> *)this_00,
                   CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        piVar3 = Vector<int,_std::allocator<int>_>::operator[]
                           ((Vector<int,_std::allocator<int>_> *)this_00,
                            CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        *piVar3 = in_stack_ffffffffffffff8c;
        local_34 = local_34 + 1;
      }
      local_30 = local_30 + 1;
    }
  }
  return in_RDI;
}

Assistant:

Vector<int> NFilesIter::FileNumbersWritten()
{
  Vector<int> fileNumbersWritten(nProcs, -1);

  if(myProc == coordinatorProc) {

#if 0
    int total(0);
    std::set<int> procSet;
    for(int f(0); f < fileNumbersWriteOrder.size(); ++f) {
      total += fileNumbersWriteOrder[f].size();
      for(int r(0); r < fileNumbersWriteOrder[f].size(); ++r) {
        procSet.insert(fileNumbersWriteOrder[f][r]);
      }
    }
    if(total != nProcs || static_cast<int>(procSet.size()) != nProcs) {
      amrex::AllPrint() << "**** Error in NFilesIter::FileNumbersWritten():  "
                << " coordinatorProc nProcs total procSet.size() = "
                << coordinatorProc << "  " << nProcs << "  "
                << total << "  " << procSet.size() << std::endl;
    }
#endif

    for(int f(0); f < fileNumbersWriteOrder.size(); ++f) {
      for(int r(0); r < fileNumbersWriteOrder[f].size(); ++r) {
        fileNumbersWritten[fileNumbersWriteOrder[f][r]] = f;
      }
    }

  }
  return fileNumbersWritten;
}